

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionCheck.cpp
# Opt level: O0

void __thiscall
AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
          (AutoNestedHandledExceptionType *this)

{
  code *pcVar1;
  Data DVar2;
  BOOL BVar3;
  undefined8 *in_FS_OFFSET;
  bool bVar4;
  AutoNestedHandledExceptionType *this_local;
  
  DVar2 = ExceptionCheck::GetData();
  bVar4 = true;
  if (DVar2.handledExceptionType != ExceptionType_DisableCheck) {
    BVar3 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
    bVar4 = true;
    if (BVar3 != 0) {
      DVar2 = ExceptionCheck::GetData();
      bVar4 = true;
      if (DVar2.handledExceptionType != ExceptionType_HasStackProbe) {
        DVar2 = ExceptionCheck::GetData();
        bVar4 = (DVar2.handledExceptionType & ExceptionType_JavascriptException) ==
                ExceptionType_JavascriptException;
      }
    }
  }
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                       ,0x65,
                       "(ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe || (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException)"
                       ,
                       "ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe || (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException"
                      );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  ExceptionCheck::ClearHandledExceptionType();
  ExceptionCheck::Restore(&this->savedData);
  return;
}

Assistant:

AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType()
{
    Assert(ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck ||
        !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() ||
        ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe ||
        (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException);
    ExceptionCheck::ClearHandledExceptionType();
    ExceptionCheck::Restore(savedData);
}